

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O0

duk_ret_t dukglue::detail::MethodInfo<false,_B,_const_char_*>::MethodRuntime::call_native_method
                    (duk_context *ctx)

{
  B *obj_00;
  tuple<> local_31;
  undefined8 *puStack_30;
  type bakedArgs;
  MethodHolder *method_holder;
  B *obj;
  void *method_holder_void;
  void *obj_void;
  duk_context *ctx_local;
  
  duk_push_this(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_c456);
  obj_00 = (B *)duk_get_pointer(ctx,-1);
  if (obj_00 == (B *)0x0) {
    duk_error_raw(ctx,-4,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                  ,0x5b,"Invalid native object for \'this\'");
  }
  duk_pop_2(ctx);
  duk_push_current_function(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_da1a);
  puStack_30 = (undefined8 *)duk_require_pointer(ctx,-1);
  if (puStack_30 == (undefined8 *)0x0) {
    duk_error_raw(ctx,-6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                  ,0x66,"Method pointer missing?!");
  }
  duk_pop_2(ctx);
  get_stack_values<>(ctx);
  MethodInfo<false,B,char_const*>::MethodRuntime::actually_call<char_const*>
            ((MethodRuntime *)ctx,(duk_context *)*puStack_30,puStack_30[1],obj_00,&local_31);
  return 1;
}

Assistant:

static duk_ret_t call_native_method(duk_context* ctx)
				{
					// get this.obj_ptr
					duk_push_this(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "obj_ptr");
					void* obj_void = duk_get_pointer(ctx, -1);
					if (obj_void == nullptr) {
						duk_error(ctx, DUK_RET_REFERENCE_ERROR, "Invalid native object for 'this'");
						return DUK_RET_REFERENCE_ERROR;
					}

					duk_pop_2(ctx); // pop this.obj_ptr and this

					// get current_function.method_info
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "method_holder");
					void* method_holder_void = duk_require_pointer(ctx, -1);
					if (method_holder_void == nullptr) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "Method pointer missing?!");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

					// (should always be valid unless someone is intentionally messing with this.obj_ptr...)
					Cls* obj = static_cast<Cls*>(obj_void);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);

					// read arguments and call method
                    auto bakedArgs = dukglue::detail::get_stack_values<Ts...>(ctx);
					actually_call(ctx, method_holder->method, obj, bakedArgs);
					return std::is_void<RetType>::value ? 0 : 1;
				}